

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O2

unsigned_long bn_sub_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  unsigned_long uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = bn_sub_words(r,a,b,cl);
  if (dl != 0) {
    if (dl < 0) {
      lVar3 = 0;
      uVar5 = 1;
      while( true ) {
        uVar4 = dl + (int)lVar3;
        uVar1 = b[cl + lVar3];
        r[cl + lVar3] = -(uVar2 + uVar1);
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if (uVar4 == 0xffffffff) break;
        uVar1 = b[(long)cl + lVar3 + 1];
        r[(long)cl + lVar3 + 1] = -(uVar2 + uVar1);
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if (uVar4 == 0xfffffffe) {
          return uVar2;
        }
        uVar1 = b[(long)cl + lVar3 + 2];
        r[(long)cl + lVar3 + 2] = -(uVar2 + uVar1);
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if (0xfffffffc < uVar4) {
          return uVar2;
        }
        uVar1 = b[(long)cl + lVar3 + 3];
        r[(long)cl + lVar3 + 3] = -(uVar2 + uVar1);
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if (uVar4 == 0xfffffffc) {
          return uVar2;
        }
        lVar3 = lVar3 + 4;
      }
    }
    else {
      uVar5 = 0;
      lVar3 = 0;
      uVar4 = dl;
      while (uVar2 != 0) {
        uVar1 = a[cl + lVar3];
        r[cl + lVar3] = uVar1 - uVar2;
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if ((int)uVar4 < 2) {
          return uVar2;
        }
        uVar1 = a[(long)cl + lVar3 + 1];
        r[(long)cl + lVar3 + 1] = uVar1 - uVar2;
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if (dl + -2 == (int)lVar3) {
          return uVar2;
        }
        uVar1 = a[(long)cl + lVar3 + 2];
        r[(long)cl + lVar3 + 2] = uVar1 - uVar2;
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        bVar6 = uVar4 < 4;
        uVar4 = uVar4 - 4;
        if (bVar6) {
          return uVar2;
        }
        uVar1 = a[(long)cl + lVar3 + 3];
        r[(long)cl + lVar3 + 3] = uVar1 - uVar2;
        if (uVar1 != 0) {
          uVar2 = uVar5;
        }
        if (dl + -4 == (int)lVar3) {
          return uVar2;
        }
        lVar3 = lVar3 + 4;
      }
      uVar2 = 0;
      while (r[cl + lVar3] = a[cl + lVar3], 1 < uVar4) {
        r[(long)cl + lVar3 + 1] = a[(long)cl + lVar3 + 1];
        if (-dl + (int)lVar3 == -2) {
          return 0;
        }
        r[(long)cl + lVar3 + 2] = a[(long)cl + lVar3 + 2];
        bVar6 = uVar4 < 4;
        uVar4 = uVar4 - 4;
        if (bVar6) {
          return 0;
        }
        r[(long)cl + lVar3 + 3] = a[(long)cl + lVar3 + 3];
        if (-dl + (int)lVar3 == -4) {
          return 0;
        }
        lVar3 = lVar3 + 4;
      }
    }
  }
  return uVar2;
}

Assistant:

BN_ULONG bn_sub_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, t;

    assert(cl >= 0);
    c = bn_sub_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        for (;;) {
            t = b[0];
            r[0] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[1];
            r[1] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[2];
            r[2] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            t = b[3];
            r[3] = (0 - t - c) & BN_MASK2;
            if (t != 0)
                c = 1;
            if (++dl >= 0)
                break;

            b += 4;
            r += 4;
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = a[0];
            r[0] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[1];
            r[1] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[2];
            r[2] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            t = a[3];
            r[3] = (t - c) & BN_MASK2;
            if (t != 0)
                c = 0;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}